

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicBeadModel.cpp
# Opt level: O3

void __thiscall OpenMD::AtomicBeadModel::createBeads(AtomicBeadModel *this,Shape *shape)

{
  int iVar1;
  long lVar2;
  Shape *pSVar3;
  Sphere *pSVar4;
  pointer ppSVar5;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> shapes;
  vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> local_48;
  
  if (shape != (Shape *)0x0) {
    iVar1 = (*shape->_vptr_Shape[7])(shape);
    if ((char)iVar1 == '\0') {
      iVar1 = (*shape->_vptr_Shape[8])(shape);
      if ((char)iVar1 == '\0') {
        memcpy(&painCave,
               "AtomicBeadModel::createBeads Error: GayBerne and other non-spherical\n\tatoms should use the RoughShell or BoundaryElement models\n"
               ,0x81);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
        return;
      }
      pSVar3 = (this->super_BeadModel).super_ApproximateModel.super_HydrodynamicsModel.shape_;
      if (pSVar3 == (Shape *)0x0) {
        pSVar4 = (Sphere *)0x0;
      }
      else {
        pSVar4 = (Sphere *)__dynamic_cast(pSVar3,&Shape::typeinfo,&Sphere::typeinfo,0);
      }
      createSingleBead(this,pSVar4);
      return;
    }
    lVar2 = __dynamic_cast(shape,&Shape::typeinfo,&CompositeShape::typeinfo,0);
    std::vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>::vector
              (&local_48,(vector<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_> *)(lVar2 + 0x40)
              );
    ppSVar5 = local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        iVar1 = (*(*ppSVar5)->_vptr_Shape[7])();
        pSVar3 = *ppSVar5;
        if ((char)iVar1 == '\0') {
          iVar1 = (*pSVar3->_vptr_Shape[8])();
          if ((char)iVar1 == '\0') {
            memcpy(&painCave,
                   "AtomicBeadModel::createBeads Error: GayBerne and other non-spherical\n\tatoms should use the RoughShell or BoundaryElement models\n"
                   ,0x81);
            painCave.isFatal = 1;
            painCave.severity = 1;
            simError();
          }
          else {
            if (*ppSVar5 == (Shape *)0x0) {
              pSVar4 = (Sphere *)0x0;
            }
            else {
              pSVar4 = (Sphere *)__dynamic_cast(*ppSVar5,&Shape::typeinfo,&Sphere::typeinfo,0);
            }
            createSingleBead(this,pSVar4);
          }
        }
        else {
          if (pSVar3 == (Shape *)0x0) {
            pSVar3 = (Shape *)0x0;
          }
          else {
            pSVar3 = (Shape *)__dynamic_cast(pSVar3,&Shape::typeinfo,&CompositeShape::typeinfo,0);
          }
          createBeads(this,pSVar3);
        }
        ppSVar5 = ppSVar5 + 1;
      } while (ppSVar5 !=
               local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<OpenMD::Shape_*,_std::allocator<OpenMD::Shape_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void AtomicBeadModel::createBeads(Shape* shape) {
    if (shape != NULL) {
      if (shape->isComposite()) {
        std::vector<Shape*> shapes =
            dynamic_cast<CompositeShape*>(shape)->getShapes();
        for (std::vector<Shape*>::iterator i = shapes.begin();
             i != shapes.end(); ++i) {
          if ((*i)->isComposite()) {
            createBeads(dynamic_cast<CompositeShape*>((*i)));
          } else {
            if ((*i)->isSpherical()) {
              createSingleBead(dynamic_cast<Sphere*>((*i)));
            } else {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "AtomicBeadModel::createBeads Error: GayBerne and other "
                       "non-spherical\n"
                       "\tatoms should use the RoughShell or BoundaryElement "
                       "models\n");
              painCave.severity = OPENMD_ERROR;
              painCave.isFatal  = 1;
              simError();
            }
          }
        }
      } else {
        if (shape->isSpherical()) {
          createSingleBead(dynamic_cast<Sphere*>(shape_));
        } else {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "AtomicBeadModel::createBeads Error: GayBerne and other "
              "non-spherical\n"
              "\tatoms should use the RoughShell or BoundaryElement models\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      }
    }
  }